

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O0

void number_suite::array_int(void)

{
  bool bVar1;
  undefined4 local_1d4;
  value local_1d0 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  undefined4 local_1b4;
  value local_1b0 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  undefined4 local_194;
  value local_190 [2];
  basic_string_view<char,_std::char_traits<char>_> local_188;
  undefined4 local_178;
  value local_174 [5];
  basic_string_view<char,_std::char_traits<char>_> local_160;
  undefined1 local_150 [8];
  chunk_reader reader;
  
  trial::protocol::json::basic_chunk_reader<char>::basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"[");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_160);
  boost::detail::test_impl
            ("reader.next(\"[\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x62,"void number_suite::array_int()",bVar1);
  local_174[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_178 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,99,"void number_suite::array_int()",local_174,&local_178);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"0");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_188);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,100,"void number_suite::array_int()",(bool)(~bVar1 & 1));
  local_190[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_194 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x65,"void number_suite::array_int()",local_190,&local_194);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"0]");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_1a8);
  boost::detail::test_impl
            ("reader.next(\"0]\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x66,"void number_suite::array_int()",bVar1);
  local_1b0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_1b4 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x67,"void number_suite::array_int()",local_1b0,&local_1b4);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"]");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_1c8);
  boost::detail::test_impl
            ("reader.next(\"]\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x68,"void number_suite::array_int()",bVar1);
  local_1d0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_1d4 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x69,"void number_suite::array_int()",local_1d0,&local_1d4);
  trial::protocol::json::basic_chunk_reader<char>::~basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  return;
}

Assistant:

void array_int()
{
    // "[0]"
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(reader.next("["));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST(!reader.next("0")); // Single zero is legal, but defer until next input
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array); // Retains old state
    TRIAL_PROTOCOL_TEST(reader.next("0]"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST(reader.next("]"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
}